

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Stress::(anonymous_namespace)::TextureSamplerCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  undefined1 local_1a8 [8];
  ostringstream buf;
  allocator<char> local_19;
  void *local_18;
  TextureSamplerCase *this_local;
  
  local_18 = this;
  this_local = (TextureSamplerCase *)__return_storage_ptr__;
  if (*(int *)((long)this + 0x84) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_out;\nvoid main ()\n{\n\tfragColor = v_out;\n}\n"
               ,&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::operator<<((ostream *)local_1a8,
                    "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\n");
    if (*(int *)((long)this + 0x88) == 3) {
      std::operator<<((ostream *)local_1a8,"uniform highp samplerCube u_sampler;\n");
    }
    else {
      std::operator<<((ostream *)local_1a8,"uniform highp sampler2D u_sampler;\n");
    }
    std::operator<<((ostream *)local_1a8,"in highp vec4 v_attr;\nvoid main ()\n{\n");
    if (*(int *)((long)this + 0x88) == 0) {
      std::operator<<((ostream *)local_1a8,"\tfragColor = texture(u_sampler, v_attr.xy);\n");
    }
    else if (*(int *)((long)this + 0x88) == 1) {
      std::operator<<((ostream *)local_1a8,
                      "\tfragColor = texture(u_sampler, v_attr.xy, v_attr.x);\n");
    }
    else if (*(int *)((long)this + 0x88) == 2) {
      std::operator<<((ostream *)local_1a8,
                      "\tfragColor = textureGrad(u_sampler, v_attr.xy, v_attr.xy, v_attr.yx);\n");
    }
    else if (*(int *)((long)this + 0x88) == 3) {
      std::operator<<((ostream *)local_1a8,
                      "\tfragColor = texture(u_sampler, vec3(v_attr.xy,v_attr.x + v_attr.y));\n");
    }
    std::operator<<((ostream *)local_1a8,"}\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextureSamplerCase::genFragmentSource (void) const
{
	// fragment shader is passthrough
	if (m_type == TYPE_VERTEX)
		return s_colorPassthroughFragmentShaderSource;

	// fragment shader does the calculations
	std::ostringstream buf;
	buf <<	"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;\n";

	if (m_testType != TEST_TEX_COORD_CUBE)
		buf <<	"uniform highp sampler2D u_sampler;\n";
	else
		buf <<	"uniform highp samplerCube u_sampler;\n";

	buf <<	"in highp vec4 v_attr;\n"
			"void main ()\n"
			"{\n";

	if (m_testType == TEST_TEX_COORD)
		buf << "	fragColor = texture(u_sampler, v_attr.xy);\n";
	else if (m_testType == TEST_LOD)
		buf << "	fragColor = texture(u_sampler, v_attr.xy, v_attr.x);\n";
	else if (m_testType == TEST_GRAD)
		buf <<	"	fragColor = textureGrad(u_sampler, v_attr.xy, v_attr.xy, v_attr.yx);\n";
	else if (m_testType == TEST_TEX_COORD_CUBE)
		buf <<	"	fragColor = texture(u_sampler, vec3(v_attr.xy,v_attr.x + v_attr.y));\n";
	else
		DE_ASSERT(DE_FALSE);

	buf <<	"}\n";

	return buf.str();
}